

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O1

void __thiscall Memory::Recycler::~Recycler(Recycler *this)

{
  HeapInfoManager *this_00;
  uint *puVar1;
  SListBase<void_*,_Memory::ArenaAllocator,_RealCount> *this_01;
  int iVar2;
  Recycler *pRVar3;
  RecyclerWeakReferenceBase **ppRVar4;
  Type pSVar5;
  TypeInfotoTrackerItemMap *pTVar6;
  BaseDictionary<const_std::type_info_*,_Memory::Recycler::TrackerItem_*,_Memory::NoCheckHeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_02;
  CCLock *this_03;
  code *pcVar7;
  bool bVar8;
  undefined4 *puVar9;
  Recycler **ppRVar10;
  Recycler *pRVar11;
  ulong uVar12;
  ulong uVar13;
  Type buffer;
  RecyclerWeakReferenceBase *pRVar14;
  char16_t *pcVar15;
  uint uVar16;
  int iVar17;
  char16_t *header;
  undefined1 local_5b8 [8];
  AutoLeakReportSection __autoLeakReportSection0;
  AutoLeakReportSection local_70;
  AutoLeakReportSection __autoLeakReportSection1;
  
  if (this->isAborting == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x1af,"(!this->isAborting)","!this->isAborting");
    if (!bVar8) goto LAB_00713e64;
    *puVar9 = 0;
  }
  CCLock::Enter(&recyclerListLock.super_CCLock);
  ppRVar10 = &recyclerList;
  if (recyclerList == this) {
LAB_00713853:
    *ppRVar10 = this->next;
  }
  else {
    pRVar3 = recyclerList;
    if (recyclerList != (Recycler *)0x0) {
      do {
        pRVar11 = pRVar3;
        pRVar3 = pRVar11->next;
      } while (pRVar3 != this);
      ppRVar10 = &pRVar11->next;
      goto LAB_00713853;
    }
  }
  CCLock::Leave(&recyclerListLock.super_CCLock);
  this->isShuttingDown = true;
  ResetThreadId(this);
  ClearObjectBeforeCollectCallbacks(this);
  if (this->recyclerFlagsTable->DumpObjectGraphOnExit == true) {
    memset((Param *)local_5b8,0,0x548);
    __autoLeakReportSection0.m_flags._1_1_ = 1;
    DumpObjectGraph(this,(Param *)local_5b8);
  }
  header = L"Destructor";
  pcVar15 = L"Destructor";
  if ((this->inDetachProcess & 1U) != 0) {
    pcVar15 = L"DetachProcess";
  }
  if (this->inDllCanUnloadNow != false) {
    pcVar15 = L"DllCanUnloadNow";
  }
  AutoLeakReportSection::AutoLeakReportSection
            ((AutoLeakReportSection *)local_5b8,this->recyclerFlagsTable,L"Recycler (%p): %s",this,
             pcVar15);
  ReportLeaks(this);
  if ((this->inDetachProcess & 1U) != 0) {
    header = L"DetachProcess";
  }
  if (this->inDllCanUnloadNow != false) {
    header = L"DllCanUnloadNow";
  }
  CheckLeaks(this,header);
  AutoLeakReportSection::AutoLeakReportSection
            (&local_70,this->recyclerFlagsTable,L"Skipped finalizers");
  if (this->concurrentThread != (HANDLE)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x1e7,"(concurrentThread == nullptr)","concurrentThread == nullptr");
    if (!bVar8) goto LAB_00713e64;
    *puVar9 = 0;
  }
  if (this->recyclerSweepManager != (RecyclerSweepManager *)0x0) {
    RecyclerSweepManager::ShutdownCleanup(this->recyclerSweepManager);
    this->recyclerSweepManager = (RecyclerSweepManager *)0x0;
  }
  if (this->mainThreadHandle != (HANDLE)0x0) {
    CloseHandle(this->mainThreadHandle);
  }
  this_00 = &this->autoHeap;
  HeapInfoManager::Close(this_00);
  __autoLeakReportSection1.m_flags = (ConfigFlagsTable *)&this->markContext;
  MarkContext::Release((MarkContext *)__autoLeakReportSection1.m_flags);
  MarkContext::Release(&this->parallelMarkContext1);
  MarkContext::Release(&this->parallelMarkContext2);
  MarkContext::Release(&this->parallelMarkContext3);
  uVar13 = (ulong)(this->weakReferenceMap).size;
  if (uVar13 == 0) {
    uVar16 = 0;
  }
  else {
    uVar12 = 0;
    uVar16 = 0;
    do {
      ppRVar4 = (this->weakReferenceMap).buckets;
      pRVar14 = ppRVar4[uVar12];
      while (pRVar14 != (RecyclerWeakReferenceBase *)0x0) {
        pRVar14->strongRef = (Type)0x0;
        pRVar14->strongRefHeapBlock = &CollectedRecyclerWeakRefHeapBlock::Instance.super_HeapBlock;
        pRVar14 = pRVar14->next;
        ppRVar4[uVar12] = pRVar14;
        uVar16 = uVar16 + 1;
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != uVar13);
  }
  if ((this->weakReferenceMap).count < uVar16) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerWeakReference.h"
                       ,0x107,"(removed <= count)","removed <= count");
    if (!bVar8) goto LAB_00713e64;
    *puVar9 = 0;
  }
  puVar1 = &(this->weakReferenceMap).count;
  *puVar1 = *puVar1 - uVar16;
  if (*puVar1 != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerWeakReference.h"
                       ,0x10b,"(countedEntries == count)","countedEntries == count");
    if (!bVar8) goto LAB_00713e64;
    *puVar9 = 0;
  }
  this_01 = &this->clientTrackedObjectList;
  buffer = (this->clientTrackedObjectList).super_SListNodeBase<Memory::ArenaAllocator>.next;
  while ((SListBase<void_*,_Memory::ArenaAllocator,_RealCount> *)buffer != this_01) {
    pSVar5 = buffer->next;
    ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
              (&(this->clientTrackedObjectAllocator).
                super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>,buffer,0x10
              );
    buffer = pSVar5;
  }
  (this->clientTrackedObjectList).super_SListNodeBase<Memory::ArenaAllocator>.next =
       &this_01->super_SListNodeBase<Memory::ArenaAllocator>;
  (this->clientTrackedObjectList).super_RealCount.count = 0;
  pTVar6 = this->trackerDictionary;
  if (pTVar6 != (TypeInfotoTrackerItemMap *)0x0) {
    if (pTVar6->bucketCount != 0) {
      uVar13 = 0;
      do {
        iVar17 = pTVar6->buckets[uVar13];
        while (iVar17 != -1) {
          iVar2 = pTVar6->entries[iVar17].
                  super_DefaultHashedEntry<const_std::type_info_*,_Memory::Recycler::TrackerItem_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                  .super_KeyValueEntry<const_std::type_info_*,_Memory::Recycler::TrackerItem_*>.
                  super_ValueEntry<Memory::Recycler::TrackerItem_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<const_std::type_info_*,_Memory::Recycler::TrackerItem_*>_>
                  .
                  super_KeyValueEntryDataLayout2<const_std::type_info_*,_Memory::Recycler::TrackerItem_*>
                  .next;
          NoCheckHeapAllocator::Free
                    ((NoCheckHeapAllocator *)&NoCheckHeapAllocator::Instance,
                     pTVar6->entries[iVar17].
                     super_DefaultHashedEntry<const_std::type_info_*,_Memory::Recycler::TrackerItem_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                     .super_KeyValueEntry<const_std::type_info_*,_Memory::Recycler::TrackerItem_*>.
                     super_ValueEntry<Memory::Recycler::TrackerItem_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<const_std::type_info_*,_Memory::Recycler::TrackerItem_*>_>
                     .
                     super_KeyValueEntryDataLayout2<const_std::type_info_*,_Memory::Recycler::TrackerItem_*>
                     .value,0x90);
          iVar17 = iVar2;
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 < pTVar6->bucketCount);
    }
    this_02 = this->trackerDictionary;
    JsUtil::
    BaseDictionary<const_std::type_info_*,_Memory::Recycler::TrackerItem_*,_Memory::NoCheckHeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::~BaseDictionary(this_02);
    NoCheckHeapAllocator::Free((NoCheckHeapAllocator *)&NoCheckHeapAllocator::Instance,this_02,0x38)
    ;
    this->trackerDictionary = (TypeInfotoTrackerItemMap *)0x0;
    this_03 = &this->trackerCriticalSection->super_CCLock;
    if (this_03 != (CCLock *)0x0) {
      CCLock::~CCLock(this_03);
      operator_delete(this_03);
    }
  }
  HeapInfoManager::ShutdownIdleDecommit(this_00);
  if (((this->collectionState).value & ~CollectionStateExit) != CollectionStateNotCollecting) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x22b,
                       "(this->collectionState == CollectionStateExit || this->collectionState == CollectionStateNotCollecting)"
                       ,
                       "this->collectionState == CollectionStateExit || this->collectionState == CollectionStateNotCollecting"
                      );
    if (!bVar8) goto LAB_00713e64;
    *puVar9 = 0;
  }
  if ((this->disableConcurrentThreadExitedCheck == false) && (this->concurrentThreadExited == false)
     ) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x22d,
                       "(this->disableConcurrentThreadExitedCheck || this->concurrentThreadExited == true)"
                       ,
                       "this->disableConcurrentThreadExitedCheck || this->concurrentThreadExited == true"
                      );
    if (!bVar8) {
LAB_00713e64:
      pcVar7 = (code *)invalidInstructionException();
      (*pcVar7)();
    }
    *puVar9 = 0;
  }
  AutoLeakReportSection::~AutoLeakReportSection(&local_70);
  AutoLeakReportSection::~AutoLeakReportSection((AutoLeakReportSection *)local_5b8);
  JsUtil::
  BaseDictionary<void_*,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::AsymetricResizeLock>
  ::~BaseDictionary(&this->pendingWriteBarrierBlockMap);
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::~ArenaAllocatorBase
            (&(this->objectBeforeCollectCallbackArena).
              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>);
  HeapInfo::~HeapInfo(&this_00->defaultHeap);
  DListBase<Memory::ArenaAllocator,_RealCount>::~DListBase(&this->backgroundProfilerArena);
  PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
  ::~PageAllocatorBase(&this->backgroundProfilerPageAllocator);
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::~ArenaAllocatorBase
            (&(this->clientTrackedObjectAllocator).
              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>);
  SListBase<void_*,_Memory::ArenaAllocator,_RealCount>::~SListBase(this_01);
  RecyclerParallelThread::~RecyclerParallelThread(&this->parallelThread2);
  RecyclerParallelThread::~RecyclerParallelThread(&this->parallelThread1);
  PagePool::~PagePool(&this->parallelMarkPagePool3);
  PagePool::~PagePool(&this->parallelMarkPagePool2);
  PagePool::~PagePool(&this->parallelMarkPagePool1);
  PagePool::~PagePool(&this->markPagePool);
  MarkContext::~MarkContext(&this->parallelMarkContext3);
  MarkContext::~MarkContext(&this->parallelMarkContext2);
  MarkContext::~MarkContext(&this->parallelMarkContext1);
  MarkContext::~MarkContext((MarkContext *)__autoLeakReportSection1.m_flags);
  DListBase<Memory::ArenaData_*,_RealCount>::~DListBase(&this->externalGuestArenaList);
  DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount>::~DListBase(&this->guestArenaList);
  SList<Memory::RecyclerWeakReferenceRegion,_Memory::HeapAllocator,_RealCount>::~SList
            (&this->weakReferenceRegionList);
  WeakReferenceHashTable<PrimePolicy>::~WeakReferenceHashTable(&this->weakReferenceMap);
  SimpleHashTable<void_*,_Memory::Recycler::PinRecord,_Memory::HeapAllocator,_DefaultComparer,_true,_PrimePolicy>
  ::~SimpleHashTable(&this->pinnedObjectMap);
  HeapBlockMap64::~HeapBlockMap64(&this->heapBlockMap);
  return;
}

Assistant:

Recycler::~Recycler()
{
#if ENABLE_CONCURRENT_GC
    Assert(!this->isAborting);
#endif
#if DBG && GLOBAL_ENABLE_WRITE_BARRIER
    recyclerListLock.Enter();
    if (recyclerList == this)
    {
        recyclerList = this->next;
    }
    else if(recyclerList)
    {
        Recycler* list = recyclerList;
        while (list->next != this)
        {
            list = list->next;
        }
        list->next = this->next;
    }
    recyclerListLock.Leave();
#endif

    // Stop any further collection
    this->isShuttingDown = true;

#if DBG
    this->ResetThreadId();
#endif

#ifdef ENABLE_JS_ETW
    FlushFreeRecord();
#endif

    ClearObjectBeforeCollectCallbacks();

#ifdef RECYCLER_DUMP_OBJECT_GRAPH
    if (GetRecyclerFlagsTable().DumpObjectGraphOnExit)
    {
        // Always skip stack here, as we may be running the dtor on another thread.
        RecyclerObjectGraphDumper::Param param = { 0 };
        param.skipStack = true;
        this->DumpObjectGraph(&param);
    }
#endif

    AUTO_LEAK_REPORT_SECTION(this->GetRecyclerFlagsTable(), _u("Recycler (%p): %s"), this, this->IsInDllCanUnloadNow()? _u("DllCanUnloadNow") :
        this->IsInDetachProcess()? _u("DetachProcess") : _u("Destructor"));
#ifdef LEAK_REPORT
    ReportLeaks();
#endif

#ifdef CHECK_MEMORY_LEAK
    CheckLeaks(this->IsInDllCanUnloadNow()? _u("DllCanUnloadNow") : this->IsInDetachProcess()? _u("DetachProcess") : _u("Destructor"));
#endif

    AUTO_LEAK_REPORT_SECTION_0(this->GetRecyclerFlagsTable(), _u("Skipped finalizers"));

#if ENABLE_CONCURRENT_GC
    Assert(concurrentThread == nullptr);

    // We only sometime clean up the state after abort concurrent to not collection
    // Still need to delete heap block that is held by the recyclerSweep
    if (recyclerSweepManager != nullptr)
    {
        recyclerSweepManager->ShutdownCleanup();
        recyclerSweepManager = nullptr;
    }

    if (mainThreadHandle != nullptr)
    {
        CloseHandle(mainThreadHandle);
    }
#endif

    autoHeap.Close();

    markContext.Release();
    parallelMarkContext1.Release();
    parallelMarkContext2.Release();
    parallelMarkContext3.Release();

    // Clean up the weak reference map so that
    // objects being finalized can safely refer to weak references
    // (this could otherwise become a problem for weak references held
    // to large objects since their block would be destroyed before
    // the finalizer was run)
    // When the recycler is shutting down, all objects are going to be reclaimed
    // so null out the weak references so that anyone relying on weak
    // references simply thinks the object has been reclaimed
    weakReferenceMap.Map([](RecyclerWeakReferenceBase * weakRef) -> bool
    {
        weakRef->strongRef = nullptr;

        // Put in a dummy heap block so that we can still do the isPendingConcurrentSweep check first.
        weakRef->strongRefHeapBlock = &CollectedRecyclerWeakRefHeapBlock::Instance;

        // Remove
        return false;
    });

#if ENABLE_PARTIAL_GC
    clientTrackedObjectList.Clear(&this->clientTrackedObjectAllocator);
#endif

#ifdef PROFILE_RECYCLER_ALLOC
    if (trackerDictionary != nullptr)
    {
        this->trackerDictionary->Map([](type_info const *, TrackerItem * item)
        {
            NoCheckHeapDelete(item);
        });
        NoCheckHeapDelete(this->trackerDictionary);
        this->trackerDictionary = nullptr;
        delete(trackerCriticalSection);
    }
#endif

#ifdef RECYCLER_MARK_TRACK
    NoCheckHeapDelete(this->markMap);
    this->markMap = nullptr;
#endif

#if DBG
    // Disable idle decommit asserts
    autoHeap.ShutdownIdleDecommit();
#endif
    Assert(this->collectionState == CollectionStateExit || this->collectionState == CollectionStateNotCollecting);
#if ENABLE_CONCURRENT_GC
    Assert(this->disableConcurrentThreadExitedCheck || this->concurrentThreadExited == true);
#endif
}